

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O0

int __thiscall Fl_Text_Editor::handle_key(Fl_Text_Editor *this)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  Fl_When FVar4;
  Fl_Text_Buffer *this_00;
  char *pcVar5;
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  Key_Func local_38;
  Key_Func f;
  int c;
  int state;
  int key;
  int dp;
  int del;
  Fl_Text_Editor *this_local;
  
  key = 0;
  _dp = this;
  iVar2 = Fl::compose(&key);
  if (iVar2 == 0) {
    iVar2 = Fl::event_key();
    uVar3 = Fl::event_state();
    pcVar5 = Fl::event_text();
    cVar1 = *pcVar5;
    uVar3 = uVar3 & 0x4d0000;
    local_38 = bound_key_function(this,iVar2,uVar3,global_key_bindings);
    if (local_38 == (Key_Func)0x0) {
      local_38 = bound_key_function(this,iVar2,uVar3,this->key_bindings);
    }
    if (local_38 == (Key_Func)0x0) {
      if ((this->default_key_function_ == (Key_Func)0x0) || (uVar3 != 0)) {
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ = (*this->default_key_function_)((int)cVar1,this);
      }
    }
    else {
      this_local._4_4_ = (*local_38)(iVar2,this);
    }
  }
  else {
    if (key != 0) {
      iVar2 = Fl_Text_Display::insert_position(&this->super_Fl_Text_Display);
      state = iVar2 - key;
      if (state < 0) {
        state = 0;
      }
      this_00 = Fl_Text_Display::buffer(&this->super_Fl_Text_Display);
      uVar3 = Fl_Text_Display::insert_position(&this->super_Fl_Text_Display);
      Fl_Text_Buffer::select(this_00,state,(fd_set *)(ulong)uVar3,in_RCX,in_R8,in_R9);
    }
    kill_selection(this);
    iVar2 = Fl::event_length();
    if (iVar2 != 0) {
      iVar2 = insert_mode(this);
      if (iVar2 == 0) {
        pcVar5 = Fl::event_text();
        Fl_Text_Display::overstrike(&this->super_Fl_Text_Display,pcVar5);
      }
      else {
        pcVar5 = Fl::event_text();
        Fl_Text_Display::insert(&this->super_Fl_Text_Display,pcVar5);
      }
    }
    Fl_Text_Display::show_insert_position(&this->super_Fl_Text_Display);
    Fl_Widget::set_changed((Fl_Widget *)this);
    FVar4 = Fl_Widget::when((Fl_Widget *)this);
    if ((FVar4 & FL_WHEN_CHANGED) != FL_WHEN_NEVER) {
      Fl_Widget::do_callback((Fl_Widget *)this);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Editor::handle_key() {
  // Call FLTK's rules to try to turn this into a printing character.
  // This uses the right-hand ctrl key as a "compose prefix" and returns
  // the changes that should be made to the text, as a number of
  // bytes to delete and a string to insert:
  int del = 0;
  if (Fl::compose(del)) {
    if (del) {
      // del is a number of bytes
      int dp = insert_position() - del;
      if ( dp < 0 ) dp = 0;
      buffer()->select(dp, insert_position());
    }
    kill_selection(this);
    if (Fl::event_length()) {
      if (insert_mode()) insert(Fl::event_text());
      else overstrike(Fl::event_text());
    }
#ifdef __APPLE__
    if (Fl::compose_state) {
      int pos = this->insert_position();
      this->buffer()->select(pos - Fl::compose_state, pos);
      }
#endif
    show_insert_position();
    set_changed();
    if (when()&FL_WHEN_CHANGED) do_callback();
    return 1;
  }

  int key = Fl::event_key(), state = Fl::event_state(), c = Fl::event_text()[0];
  state &= FL_SHIFT|FL_CTRL|FL_ALT|FL_META; // only care about these states
  Key_Func f;
  f = bound_key_function(key, state, global_key_bindings);
  if (!f) f = bound_key_function(key, state, key_bindings);
  if (f) return f(key, this);
  if (default_key_function_ && !state) return default_key_function_(c, this);
  return 0;
}